

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.h
# Opt level: O3

void __thiscall HighsDomain::setupObjectivePropagation(HighsDomain *this)

{
  pointer pOVar1;
  pointer ppVar2;
  pointer pdVar3;
  pointer pPVar4;
  ObjectivePropagation local_b0;
  
  ObjectivePropagation::ObjectivePropagation(&local_b0,this);
  *(ulong *)((long)&(this->objProp_).numInfObjLower + 1) =
       CONCAT17(local_b0.capacityThreshold._0_1_,local_b0._41_7_);
  *(undefined8 *)((long)&(this->objProp_).capacityThreshold + 1) = local_b0._49_8_;
  (this->objProp_).objectiveLower.lo = local_b0.objectiveLower.lo;
  *(ulong *)&(this->objProp_).numInfObjLower =
       CONCAT71(local_b0._41_7_,(undefined1)local_b0.numInfObjLower);
  (this->objProp_).cost = local_b0.cost;
  (this->objProp_).objectiveLower.hi = local_b0.objectiveLower.hi;
  (this->objProp_).domain = local_b0.domain;
  (this->objProp_).objFunc = local_b0.objFunc;
  pOVar1 = (this->objProp_).objectiveLowerContributions.
           super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->objProp_).objectiveLowerContributions.
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b0.objectiveLowerContributions.
       super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->objProp_).objectiveLowerContributions.
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b0.objectiveLowerContributions.
       super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->objProp_).objectiveLowerContributions.
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b0.objectiveLowerContributions.
       super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b0.objectiveLowerContributions.
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.objectiveLowerContributions.
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.objectiveLowerContributions.
  super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pOVar1 != (pointer)0x0) {
    operator_delete(pOVar1);
  }
  ppVar2 = (this->objProp_).contributionPartitionSets.
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->objProp_).contributionPartitionSets.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_b0.contributionPartitionSets.
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->objProp_).contributionPartitionSets.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_b0.contributionPartitionSets.
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->objProp_).contributionPartitionSets.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b0.contributionPartitionSets.
       super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b0.contributionPartitionSets.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.contributionPartitionSets.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.contributionPartitionSets.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2);
  }
  pdVar3 = (this->objProp_).propagationConsBuffer.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  (this->objProp_).propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_start =
       local_b0.propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->objProp_).propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_finish =
       local_b0.propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->objProp_).propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       local_b0.propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_b0.propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3);
  }
  pPVar4 = (this->objProp_).partitionCliqueData.
           super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->objProp_).partitionCliqueData.
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_b0.partitionCliqueData.
       super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->objProp_).partitionCliqueData.
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_b0.partitionCliqueData.
       super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->objProp_).partitionCliqueData.
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_b0.partitionCliqueData.
       super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b0.partitionCliqueData.
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.partitionCliqueData.
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.partitionCliqueData.
  super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pPVar4 != (pointer)0x0) {
    operator_delete(pPVar4);
    if (local_b0.partitionCliqueData.
        super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.partitionCliqueData.
                      super__Vector_base<HighsDomain::ObjectivePropagation::PartitionCliqueData,_std::allocator<HighsDomain::ObjectivePropagation::PartitionCliqueData>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_b0.propagationConsBuffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.propagationConsBuffer.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.contributionPartitionSets.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.contributionPartitionSets.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.objectiveLowerContributions.
      super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.objectiveLowerContributions.
                    super__Vector_base<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void setupObjectivePropagation() { objProp_ = ObjectivePropagation(this); }